

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zhuffman_decode_slowpath(stbi__zbuf *a,stbi__zhuffman *z)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  int k;
  int s;
  int b;
  undefined4 local_20;
  undefined4 local_4;
  
  iVar1 = stbi__bit_reverse(0,0x1bcd00);
  local_20 = 10;
  while (*(int *)(in_RSI + 0x420 + (long)(int)local_20 * 4) <= iVar1) {
    local_20 = local_20 + 1;
  }
  if ((int)local_20 < 0x10) {
    iVar1 = ((iVar1 >> (0x10 - (byte)local_20 & 0x1f)) -
            (uint)*(ushort *)(in_RSI + 0x400 + (long)(int)local_20 * 2)) +
            (uint)*(ushort *)(in_RSI + 0x464 + (long)(int)local_20 * 2);
    if (iVar1 < 0x120) {
      if (*(byte *)(in_RSI + 0x484 + (long)iVar1) == local_20) {
        *(uint *)(in_RDI + 0x18) = *(uint *)(in_RDI + 0x18) >> ((byte)local_20 & 0x1f);
        *(uint *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) - local_20;
        local_4 = (uint)*(ushort *)(in_RSI + 0x5a4 + (long)iVar1 * 2);
      }
      else {
        local_4 = 0xffffffff;
      }
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

static int stbi__zhuffman_decode_slowpath(stbi__zbuf *a, stbi__zhuffman *z)
{
   int b,s,k;
   // not resolved by fast table, so compute it the slow way
   // use jpeg approach, which requires MSbits at top
   k = stbi__bit_reverse(a->code_buffer, 16);
   for (s=STBI__ZFAST_BITS+1; ; ++s)
      if (k < z->maxcode[s])
         break;
   if (s >= 16) return -1; // invalid code!
   // code size is s, so:
   b = (k >> (16-s)) - z->firstcode[s] + z->firstsymbol[s];
   if (b >= STBI__ZNSYMS) return -1; // some data was corrupt somewhere!
   if (z->size[b] != s) return -1;  // was originally an assert, but report failure instead.
   a->code_buffer >>= s;
   a->num_bits -= s;
   return z->value[b];
}